

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barcode.h
# Opt level: O2

void __thiscall
barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::remaining_homology_is_trivial
          (barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           *this)

{
  ostream *poVar1;
  
  poVar1 = std::endl<char,std::char_traits<char>>
                     ((ostream *)
                      &(this->
                       super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                       ).outstream);
  poVar1 = std::operator<<(poVar1,"The remaining homology groups are trivial.");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void remaining_homology_is_trivial() {
		file_output_t<Complex>::outstream << std::endl << "The remaining homology groups are trivial." << std::endl;
	}